

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O2

SnapShot * __thiscall TTD::SnapshotExtractor::CompleteSnapshot(SnapshotExtractor *this)

{
  SnapShot *pSVar1;
  double dVar2;
  double dVar3;
  
  pSVar1 = this->m_pendingSnap;
  UnloadDataFromExtractor(this);
  this->m_snapshotsTakenCount = this->m_snapshotsTakenCount + 1;
  dVar2 = pSVar1->MarkTime;
  dVar3 = pSVar1->ExtractTime;
  this->m_totalMarkMillis = this->m_totalMarkMillis + dVar2;
  this->m_totalExtractMillis = this->m_totalExtractMillis + dVar3;
  if (this->m_maxMarkMillis <= dVar2 && dVar2 != this->m_maxMarkMillis) {
    this->m_maxMarkMillis = dVar2;
  }
  if (this->m_maxExtractMillis <= dVar3 && dVar3 != this->m_maxExtractMillis) {
    this->m_maxExtractMillis = dVar3;
  }
  this->m_lastMarkMillis = dVar2;
  this->m_lastExtractMillis = dVar3;
  return pSVar1;
}

Assistant:

SnapShot* SnapshotExtractor::CompleteSnapshot()
    {
        SnapShot* snap = this->m_pendingSnap;
        this->UnloadDataFromExtractor();

        this->m_snapshotsTakenCount++;
        this->m_totalMarkMillis += snap->MarkTime;
        this->m_totalExtractMillis += snap->ExtractTime;

        if(this->m_maxMarkMillis < snap->MarkTime)
        {
            this->m_maxMarkMillis = snap->MarkTime;
        }

        if(this->m_maxExtractMillis < snap->ExtractTime)
        {
            this->m_maxExtractMillis = snap->ExtractTime;
        }

        this->m_lastMarkMillis = snap->MarkTime;
        this->m_lastExtractMillis = snap->ExtractTime;

        return snap;
    }